

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_add_mhmarker
                   (opj_codestream_index_t *cstr_index,OPJ_UINT32 type,OPJ_OFF_T pos,OPJ_UINT32 len)

{
  OPJ_BOOL OVar1;
  ulong uVar2;
  opj_marker_info_t *poVar3;
  uint uVar4;
  uint uVar5;
  
  if (cstr_index == (opj_codestream_index_t *)0x0) {
    __assert_fail("cstr_index != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1ce7,
                  "OPJ_BOOL opj_j2k_add_mhmarker(opj_codestream_index_t *, OPJ_UINT32, OPJ_OFF_T, OPJ_UINT32)"
                 );
  }
  uVar5 = cstr_index->marknum;
  uVar4 = uVar5 + 1;
  if (cstr_index->maxmarknum < uVar4) {
    uVar2 = (ulong)((float)cstr_index->maxmarknum + 100.0);
    cstr_index->maxmarknum = (OPJ_UINT32)uVar2;
    poVar3 = (opj_marker_info_t *)opj_realloc(cstr_index->marker,(uVar2 & 0xffffffff) * 0x18);
    if (poVar3 == (opj_marker_info_t *)0x0) {
      opj_free(cstr_index->marker);
      cstr_index->marker = (opj_marker_info_t *)0x0;
      cstr_index->maxmarknum = 0;
      uVar4 = 0;
      OVar1 = 0;
      goto LAB_00114f61;
    }
    cstr_index->marker = poVar3;
    uVar5 = cstr_index->marknum;
    uVar4 = uVar5 + 1;
  }
  else {
    poVar3 = cstr_index->marker;
  }
  poVar3[uVar5].type = (unsigned_short)type;
  poVar3[uVar5].pos = (long)(int)pos;
  poVar3[uVar5].len = len;
  OVar1 = 1;
LAB_00114f61:
  cstr_index->marknum = uVar4;
  return OVar1;
}

Assistant:

static OPJ_BOOL opj_j2k_add_mhmarker(opj_codestream_index_t *cstr_index,
                                     OPJ_UINT32 type, OPJ_OFF_T pos, OPJ_UINT32 len)
{
    assert(cstr_index != 00);

    /* expand the list? */
    if ((cstr_index->marknum + 1) > cstr_index->maxmarknum) {
        opj_marker_info_t *new_marker;
        cstr_index->maxmarknum = (OPJ_UINT32)(100 + (OPJ_FLOAT32)
                                              cstr_index->maxmarknum);
        new_marker = (opj_marker_info_t *) opj_realloc(cstr_index->marker,
                     cstr_index->maxmarknum * sizeof(opj_marker_info_t));
        if (! new_marker) {
            opj_free(cstr_index->marker);
            cstr_index->marker = NULL;
            cstr_index->maxmarknum = 0;
            cstr_index->marknum = 0;
            /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add mh marker\n"); */
            return OPJ_FALSE;
        }
        cstr_index->marker = new_marker;
    }

    /* add the marker */
    cstr_index->marker[cstr_index->marknum].type = (OPJ_UINT16)type;
    cstr_index->marker[cstr_index->marknum].pos = (OPJ_INT32)pos;
    cstr_index->marker[cstr_index->marknum].len = (OPJ_INT32)len;
    cstr_index->marknum++;
    return OPJ_TRUE;
}